

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O1

RealType __thiscall
QuantLib::Problem::DotProduct
          (Problem *this,DynamicVector<double,_std::allocator<double>_> *v1,
          DynamicVector<double,_std::allocator<double>_> *v2)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  
  pdVar1 = (v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 3;
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar4 = dVar4 + pdVar1[lVar3] *
                      (v2->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
    return dVar4;
  }
  return 0.0;
}

Assistant:

RealType Problem::DotProduct(DynamicVector<RealType>& v1,
                               DynamicVector<RealType>& v2) {
    RealType dp = dot(v1, v2);
    return dp;
  }